

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::parseIdent(Lexer *this)

{
  Token TVar1;
  char *__s1;
  int iVar2;
  ulong uVar3;
  char *__s2;
  bool bVar4;
  anon_struct_16_2_6b51f6ec *local_28;
  anon_struct_16_2_6b51f6ec *i;
  bool isHex;
  Lexer *this_local;
  
  std::__cxx11::string::clear();
  iVar2 = currentChar(this);
  std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
  i._7_1_ = isHexChar(this);
  nextChar(this,true);
  while( true ) {
    iVar2 = currentChar(this);
    iVar2 = isalnum(iVar2);
    bVar4 = true;
    if (iVar2 == 0) {
      iVar2 = currentChar(this);
      bVar4 = true;
      if (iVar2 != 0x5f) {
        iVar2 = currentChar(this);
        bVar4 = iVar2 == 0x2e;
      }
    }
    if (!bVar4) break;
    iVar2 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
    bVar4 = isHexChar(this);
    if (!bVar4) {
      i._7_1_ = false;
    }
    nextChar(this,true);
  }
  iVar2 = currentChar(this);
  if ((iVar2 == 0x3a) && (i._7_1_ == false)) {
    nextChar(this,true);
    this_local._4_4_ = NamedParam;
  }
  else {
    uVar3 = std::__cxx11::string::size();
    if ((uVar3 < 5) && ((i._7_1_ != false && (iVar2 = currentChar(this), iVar2 == 0x3a)))) {
      this_local._4_4_ = continueParseIPv6(this,true);
    }
    else {
      uVar3 = std::__cxx11::string::size();
      if ((uVar3 < 4) && ((i._7_1_ != false && (bVar4 = isHexChar(this), bVar4)))) {
        this_local._4_4_ = continueParseIPv6(this,false);
      }
      else {
        for (local_28 = parseIdent::keywords; local_28->symbol != (char *)0x0;
            local_28 = local_28 + 1) {
          __s1 = local_28->symbol;
          __s2 = (char *)std::__cxx11::string::c_str();
          iVar2 = strcmp(__s1,__s2);
          if (iVar2 == 0) {
            TVar1 = local_28->token;
            this->token_ = TVar1;
            return TVar1;
          }
        }
        bVar4 = std::operator==(&this->stringValue_,"true");
        if ((bVar4) || (bVar4 = std::operator==(&this->stringValue_,"yes"), bVar4)) {
          this->numberValue_ = 1;
          this->token_ = Boolean;
          this_local._4_4_ = Boolean;
        }
        else {
          bVar4 = std::operator==(&this->stringValue_,"false");
          if ((bVar4) || (bVar4 = std::operator==(&this->stringValue_,"no"), bVar4)) {
            this->numberValue_ = 0;
            this->token_ = Boolean;
            this_local._4_4_ = Boolean;
          }
          else {
            this->token_ = Ident;
            this_local._4_4_ = Ident;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Token Lexer::parseIdent() {
  stringValue_.clear();
  stringValue_ += static_cast<char>(currentChar());
  bool isHex = isHexChar();

  nextChar();

  while (std::isalnum(currentChar()) || currentChar() == '_' ||
         currentChar() == '.') {
    stringValue_ += static_cast<char>(currentChar());
    if (!isHexChar()) isHex = false;

    nextChar();
  }

  if (currentChar() == ':' && !isHex) {
    nextChar();  // skip ':'
    return Token::NamedParam;
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && isHex && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHex && isHexChar())
    return continueParseIPv6(false);

  static struct {
    const char* symbol;
    Token token;
  } keywords[] = {{"in", Token::In},
                  {"var", Token::Var},
                  {"match", Token::Match},
                  {"on", Token::On},
                  {"for", Token::For},
                  {"do", Token::Do},
                  {"if", Token::If},
                  {"then", Token::Then},
                  {"else", Token::Else},
                  {"while", Token::While},
                  {"unless", Token::Unless},
                  {"import", Token::Import},
                  {"from", Token::From},
                  {"handler", Token::Handler},
                  {"and", Token::And},
                  {"or", Token::Or},
                  {"xor", Token::Xor},
                  {"not", Token::Not},
                  {"shl", Token::Shl},
                  {"shr", Token::Shr},
                  {"bool", Token::BoolType},
                  {"int", Token::NumberType},
                  {"string", Token::StringType},
                  {nullptr, Token::Unknown}};

  for (auto i = keywords; i->symbol; ++i)
    if (strcmp(i->symbol, stringValue_.c_str()) == 0) return token_ = i->token;

  if (stringValue_ == "true" || stringValue_ == "yes") {
    numberValue_ = 1;
    return token_ = Token::Boolean;
  }

  if (stringValue_ == "false" || stringValue_ == "no") {
    numberValue_ = 0;
    return token_ = Token::Boolean;
  }

  return token_ = Token::Ident;
}